

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O2

void cali_unpack_snapshot(uchar *buf,size_t *bytes_read,cali_entry_proc_fn proc_fn,void *user_arg)

{
  int iVar1;
  Node *node;
  Node *pNVar2;
  size_t pos;
  size_t n;
  size_t pos_1;
  Caliper c;
  size_t local_a8;
  size_t local_a0;
  Entry local_98;
  size_t local_80;
  CompressedSnapshotRecordView local_78;
  Caliper local_50;
  
  local_a8 = 0;
  cali::Caliper::Caliper(&local_50);
  cali::CompressedSnapshotRecordView::CompressedSnapshotRecordView(&local_78,buf,&local_a8);
  local_a0 = 0;
  local_80 = 1;
  do {
    while( true ) {
      if (local_78.m_num_imm + local_78.m_num_nodes <= local_a0) goto LAB_0021aad6;
      cali::CompressedSnapshotRecordView::unpack_next_entry
                (&local_98,&local_78,&local_50.super_CaliperMetadataAccessInterface,&local_a0,
                 &local_80);
      pNVar2 = local_98.m_node;
      if ((local_98.m_node != (Node *)0x0) && ((local_98.m_node)->m_attribute == 8)) break;
      for (; (pNVar2 != (Node *)0x0 && (pNVar2->m_id != 0xffffffffffffffff));
          pNVar2 = *(Node **)((long)&(((pNVar2->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                                     super_LockfreeIntrusiveTree<cali::Node>).m_me +
                             (pNVar2->super_LockfreeIntrusiveTree<cali::Node>).m_node)) {
        iVar1 = (*proc_fn)(user_arg,pNVar2->m_attribute,(pNVar2->m_data).m_v);
        if (iVar1 == 0) goto LAB_0021aad6;
      }
    }
    iVar1 = (*proc_fn)(user_arg,(local_98.m_node)->m_id,local_98.m_value.m_v);
  } while (iVar1 != 0);
LAB_0021aad6:
  if (bytes_read != (size_t *)0x0) {
    *bytes_read = *bytes_read + local_a8;
  }
  return;
}

Assistant:

void cali_unpack_snapshot(const unsigned char* buf, size_t* bytes_read, cali_entry_proc_fn proc_fn, void* user_arg)
{
    size_t          pos = 0;
    ::UnpackEntryOp op(proc_fn, user_arg);

    // FIXME: Need sigsafe instance? Only does read-only
    // node-by-id lookup though, so we should be safe
    Caliper c;

    CompressedSnapshotRecordView(buf, &pos).unpack(&c, op);

    if (bytes_read)
        *bytes_read += pos;
}